

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O1

void __thiscall
glcts::anon_unknown_0::SubroutineFunction::~SubroutineFunction(SubroutineFunction *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->name)._M_dataplus._M_p;
  paVar1 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  UniformValue::~UniformValue(&this->embeddedRetVal);
  return;
}

Assistant:

SubroutineFunction(UniformValueGenerator& generator, Index _index = Index::Implicit())
		: index(_index), embeddedRetVal(GL_FLOAT_VEC4, generator)
	{
	}